

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O0

void spell_word_of_recall(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  CHAR_DATA *in_RCX;
  CHAR_DATA *in_RDX;
  __type_conflict2 _Var4;
  char_data **in_stack_00000078;
  _func_void_char_data_ptr_room_index_data_ptr *in_stack_00000080;
  ROOM_INDEX_DATA *location;
  CHAR_DATA *victim;
  CHAR_DATA *in_stack_ffffffffffffff48;
  CHAR_DATA *in_stack_ffffffffffffff50;
  CHAR_DATA *in_stack_ffffffffffffff58;
  CHAR_DATA *ch_00;
  char *in_stack_ffffffffffffff60;
  allocator<char> *txt;
  undefined1 local_89 [9];
  allocator<char> *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  allocator<char> local_51;
  string local_50 [32];
  ROOM_INDEX_DATA *local_30;
  CHAR_DATA *local_28;
  CHAR_DATA *local_10;
  
  local_28 = in_RCX;
  local_10 = in_RDX;
  bVar2 = trusts(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  if (bVar2) {
    local_30 = get_room_index((int)((ulong)in_stack_ffffffffffffff58 >> 0x20));
    if ((local_30 == (ROOM_INDEX_DATA *)0x0) &&
       (local_30 = get_room_index((int)((ulong)in_stack_ffffffffffffff58 >> 0x20)),
       local_30 == (ROOM_INDEX_DATA *)0x0)) {
      send_to_char(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    }
    else {
      uVar1 = local_28->in_room->room_flags[0];
      _Var4 = std::pow<int,int>(0,0x61ca89);
      if (((((uVar1 & (long)_Var4) != 0) &&
           (bVar2 = is_affected_room(local_10->in_room,(int)gsn_consecrate), !bVar2)) ||
          ((bVar2 = is_affected_room(local_10->in_room,(int)gsn_plasma_cube), bVar2 &&
           (iVar3 = number_percent(), iVar3 < 0x32)))) ||
         (bVar2 = is_npc(in_stack_ffffffffffffff48), bVar2)) {
        send_to_char(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      }
      else {
        bVar2 = is_affected(local_28,(int)gsn_bind_feet);
        if (bVar2) {
          send_to_char(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        }
        else {
          if (local_10 != local_28) {
            act(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                in_stack_ffffffffffffff48,0);
          }
          txt = &local_51;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          ch_00 = (CHAR_DATA *)local_89;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          CQueue::AddToQueue<void(*)(char_data*,room_index_data*),char_data*&,room_index_data*&>
                    ((CQueue *)vo,target,(string *)victim,(string *)location,in_stack_00000080,
                     in_stack_00000078,(room_index_data **)CONCAT44(sn,level));
          std::__cxx11::string::~string((string *)(local_89 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_89);
          std::__cxx11::string::~string(local_50);
          std::allocator<char>::~allocator(&local_51);
          send_to_char((char *)txt,ch_00);
          local_28->disrupted = false;
        }
      }
    }
  }
  else {
    send_to_char(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  return;
}

Assistant:

void spell_word_of_recall(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	ROOM_INDEX_DATA *location;

	if (!trusts(ch, victim))
	{
		send_to_char("They won't allow you to do that to them.\n\r", ch);
		return;
	}

	location = get_room_index(hometown_table[victim->hometown].recall);

	if (location == nullptr)
	{
		location = get_room_index(ROOM_VNUM_TEMPLE);

		if (location == nullptr)
		{
			send_to_char("You are completely lost.\n\r", victim);
			return;
		}
	}

	if ((IS_SET(victim->in_room->room_flags, ROOM_NO_RECALL) && !is_affected_room(ch->in_room, gsn_consecrate))
		|| (is_affected_room(ch->in_room, gsn_plasma_cube) && number_percent() < 50)
		|| is_npc(victim))
	{
		send_to_char("Spell failed.\n\r", victim);
		return;
	}

	if (is_affected(victim, gsn_bind_feet))
	{
		send_to_char("Your feet are rooted to the ground!\n\r", victim);
		return;
	}

	if (ch != victim)
		act("You prepare to send $N home.", ch, 0, victim, TO_CHAR);

	RS.Queue.AddToQueue(6, "spell_word_of_recall", "recall_execute", recall_execute, victim, location);

	send_to_char("A tingling feeling runs down your spine for a moment.\n\r", victim);

	victim->disrupted = false;
}